

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

bool __thiscall
OpenMesh::IO::_PLYReader_::read_binary
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,bool param_3,Options *_opt)

{
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  *this_00;
  BaseHandle BVar1;
  BaseHandle BVar2;
  mapped_type *pmVar3;
  mostream *pmVar4;
  uint uVar5;
  ulong uVar6;
  BaseHandle local_bc;
  BaseHandle local_b8;
  uint k;
  uint l;
  uint idx;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  undefined1 auStack_88 [8];
  VHandles vhandles;
  BaseHandle local_68;
  BaseHandle local_64;
  uint local_60;
  uint nV;
  int iStack_58;
  Vec4i c;
  uint local_44;
  float tmp;
  BaseHandle local_34;
  
  _tmp = _in;
  c.super_VectorDataT<int,_4>.values_[2]._3_1_ = can_u_read(this,_in);
  if ((bool)c.super_VectorDataT<int,_4>.values_[2]._3_1_) {
    auStack_88 = (undefined1  [8])0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*_bi->_vptr_BaseImporter[0x1b])
              (_bi,(ulong)this->vertexCount_,(ulong)(this->vertexCount_ * 3),(ulong)this->faceCount_
              );
    if (this->vertexCount_ != 0) {
      this_00 = &this->vertexPropertyMap_;
      uVar5 = 0;
      do {
        if (((byte)_tmp[*(long *)(*(long *)_tmp + -0x18) + 0x20] & 2) != 0) break;
        _l = 0;
        v.super_VectorDataT<float,_3>.values_[0] = 0.0;
        v.super_VectorDataT<float,_3>.values_[1] = 0.0;
        v.super_VectorDataT<float,_3>.values_[2] = 0.0;
        n.super_VectorDataT<float,_3>.values_[0] = 0.0;
        n.super_VectorDataT<float,_3>.values_[1] = 0.0;
        n.super_VectorDataT<float,_3>.values_[2] = 0.0;
        nV = 0;
        iStack_58 = 0;
        c.super_VectorDataT<int,_4>.values_[0] = 0;
        c.super_VectorDataT<int,_4>.values_[1] = 0xff;
        local_60 = uVar5;
        if (this->vertexPropertyCount_ != 0) {
          uVar5 = 0;
          do {
            local_34.idx_ = uVar5;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,&local_34.idx_);
            switch(pmVar3->property) {
            case XCOORD:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,(float *)&l);
              break;
            case YCOORD:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,(float *)&idx);
              break;
            case ZCOORD:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,(float *)&v);
              break;
            case TEXX:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,n.super_VectorDataT<float,_3>.values_ + 1);
              break;
            case TEXY:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,n.super_VectorDataT<float,_3>.values_ + 2);
              break;
            case COLORRED:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              if ((pmVar3->value == ValueTypeFLOAT32) ||
                 (local_44 = uVar5,
                 pmVar3 = std::
                          map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                          ::operator[](this_00,(key_type *)&local_44),
                 pmVar3->value == ValueTypeFLOAT)) {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readValue(this,pmVar3->value,_tmp,(float *)(c.super_VectorDataT<int,_4>.values_ + 3)
                         );
                nV = (uint)((float)c.super_VectorDataT<int,_4>.values_[3] * 255.0);
              }
              else {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readInteger(this,pmVar3->value,_tmp,(int *)&nV);
              }
              break;
            case COLORGREEN:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              if ((pmVar3->value == ValueTypeFLOAT32) ||
                 (local_44 = uVar5,
                 pmVar3 = std::
                          map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                          ::operator[](this_00,(key_type *)&local_44),
                 pmVar3->value == ValueTypeFLOAT)) {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readValue(this,pmVar3->value,_tmp,(float *)(c.super_VectorDataT<int,_4>.values_ + 3)
                         );
                iStack_58 = (int)((float)c.super_VectorDataT<int,_4>.values_[3] * 255.0);
              }
              else {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readInteger(this,pmVar3->value,_tmp,&iStack_58);
              }
              break;
            case COLORBLUE:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              if ((pmVar3->value == ValueTypeFLOAT32) ||
                 (local_44 = uVar5,
                 pmVar3 = std::
                          map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                          ::operator[](this_00,(key_type *)&local_44),
                 pmVar3->value == ValueTypeFLOAT)) {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readValue(this,pmVar3->value,_tmp,(float *)(c.super_VectorDataT<int,_4>.values_ + 3)
                         );
                c.super_VectorDataT<int,_4>.values_[0] =
                     (int)((float)c.super_VectorDataT<int,_4>.values_[3] * 255.0);
              }
              else {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readInteger(this,pmVar3->value,_tmp,(int *)&c);
              }
              break;
            case COLORALPHA:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              if ((pmVar3->value == ValueTypeFLOAT32) ||
                 (local_44 = uVar5,
                 pmVar3 = std::
                          map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                          ::operator[](this_00,(key_type *)&local_44),
                 pmVar3->value == ValueTypeFLOAT)) {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readValue(this,pmVar3->value,_tmp,(float *)(c.super_VectorDataT<int,_4>.values_ + 3)
                         );
                c.super_VectorDataT<int,_4>.values_[1] =
                     (int)((float)c.super_VectorDataT<int,_4>.values_[3] * 255.0);
              }
              else {
                local_34.idx_ = uVar5;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,&local_34.idx_);
                readInteger(this,pmVar3->value,_tmp,c.super_VectorDataT<int,_4>.values_ + 1);
              }
              break;
            case XNORM:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,v.super_VectorDataT<float,_3>.values_ + 1);
              break;
            case YNORM:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,v.super_VectorDataT<float,_3>.values_ + 2);
              break;
            case ZNORM:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              readValue(this,pmVar3->value,_tmp,(float *)&n);
              break;
            default:
              local_34.idx_ = uVar5;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,&local_34.idx_);
              std::
              map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
              ::operator[](&this->scalar_size_,&pmVar3->value);
              std::istream::read((char *)_tmp,(long)this->buff);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < this->vertexPropertyCount_);
        }
        uVar5 = (*_bi->_vptr_BaseImporter[2])(_bi,&l);
        uVar6 = (ulong)uVar5;
        uVar5 = _opt->flags_;
        if ((uVar5 & 0x10) != 0) {
          (*_bi->_vptr_BaseImporter[8])(_bi,uVar6,v.super_VectorDataT<float,_3>.values_ + 1);
          uVar5 = _opt->flags_;
        }
        if ((uVar5 & 0x40) != 0) {
          (*_bi->_vptr_BaseImporter[0xd])(_bi,uVar6,n.super_VectorDataT<float,_3>.values_ + 1);
          uVar5 = _opt->flags_;
        }
        if ((uVar5 & 0x20) != 0) {
          local_34.idx_ =
               CONCAT13((undefined1)c.super_VectorDataT<int,_4>.values_[1],
                        CONCAT12((undefined1)c.super_VectorDataT<int,_4>.values_[0],
                                 CONCAT11((undefined1)iStack_58,(char)nV)));
          (*_bi->_vptr_BaseImporter[10])(_bi,uVar6,&local_34);
        }
        uVar5 = local_60 + 1;
      } while (uVar5 < this->vertexCount_);
    }
    if (this->faceCount_ != 0) {
      uVar5 = 0;
      do {
        readValue(this,this->faceIndexType_,_tmp,(uint *)&local_64);
        BVar2.idx_ = local_64.idx_;
        if (local_64.idx_ == 3) {
          std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                    ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                     auStack_88,3);
          readInteger(this,this->faceEntryType_,_tmp,(uint *)&local_68);
          readInteger(this,this->faceEntryType_,_tmp,(uint *)&local_bc);
          readInteger(this,this->faceEntryType_,_tmp,(uint *)&local_b8);
          ((BaseHandle *)auStack_88)->idx_ = local_68.idx_;
          (((pointer)((long)auStack_88 + 4))->super_BaseHandle).idx_ = local_bc.idx_;
          (((pointer)((long)auStack_88 + 8))->super_BaseHandle).idx_ = local_b8.idx_;
        }
        else {
          BVar1.idx_ = local_64.idx_;
          if ((undefined1  [8])
              vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_start != auStack_88) {
            vhandles.
            super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_88;
          }
          for (; BVar1.idx_ != 0; BVar1.idx_ = BVar1.idx_ + -1) {
            readInteger(this,this->faceEntryType_,_tmp,&k);
            local_34.idx_ = k;
            if (vhandles.
                super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                vhandles.
                super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
              _M_realloc_insert<OpenMesh::VertexHandle>
                        ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                         auStack_88,
                         (iterator)
                         vhandles.
                         super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                         ._M_impl.super__Vector_impl_data._M_start,(VertexHandle *)&local_34);
            }
            else {
              ((vhandles.
                super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
                _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = k;
              vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   vhandles.
                   super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          local_68.idx_ = BVar2.idx_;
        }
        (*_bi->_vptr_BaseImporter[4])(_bi,auStack_88);
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->faceCount_);
      if (auStack_88 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_88);
      }
    }
  }
  else {
    pmVar4 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar4->super_ostream,"[PLYReader] : Unable to parse header\n",0x25);
  }
  return (bool)c.super_VectorDataT<int,_4>.values_[2]._3_1_;
}

Assistant:

bool _PLYReader_::read_binary(std::istream& _in, BaseImporter& _bi, bool /*_swap*/, const Options& _opt) const {

    // Reparse the header
    if (!can_u_read(_in)) {
        omerr() << "[PLYReader] : Unable to parse header\n";
        return false;
    }

    unsigned int i, j, k, l, idx;
    unsigned int nV;
    OpenMesh::Vec3f        v, n;  // Vertex
    OpenMesh::Vec2f        t;  // TexCoords
    BaseImporter::VHandles vhandles;
    VertexHandle           vh;
    OpenMesh::Vec4i        c;  // Color
    float                  tmp;

    _bi.reserve(vertexCount_, 3* vertexCount_ , faceCount_);

    // read vertices:
    for (i = 0; i < vertexCount_ && !_in.eof(); ++i) {
        v[0] = 0.0;
        v[1] = 0.0;
        v[2] = 0.0;

        n[0] = 0.0;
        n[1] = 0.0;
        n[2] = 0.0;

        t[0] = 0.0;
        t[1] = 0.0;

        c[0] = 0;
        c[1] = 0;
        c[2] = 0;
        c[3] = 255;

        for (uint propertyIndex = 0; propertyIndex < vertexPropertyCount_; ++propertyIndex) {
            switch (vertexPropertyMap_[propertyIndex].property) {
            case XCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[0]);
                break;
            case YCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[1]);
                break;
            case ZCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[2]);
                break;
            case XNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[0]);
                break;
            case YNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[1]);
                break;
            case ZNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[2]);
                break;
            case TEXX:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, t[0]);
                break;
            case TEXY:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, t[1]);
                break;
            case COLORRED:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);

                    c[0] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[0]);

                break;
            case COLORGREEN:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[1] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[1]);

                break;
            case COLORBLUE:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[2] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[2]);

                break;
            case COLORALPHA:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[3] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[3]);

                break;
            default:
                // Read unsupported property
                consume_input(_in, scalar_size_[vertexPropertyMap_[propertyIndex].value]);
                break;
            }

        }

        vh = _bi.add_vertex(v);
        if (_opt.vertex_has_normal())
          _bi.set_normal(vh, n);
        if (_opt.vertex_has_texcoord())
          _bi.set_texcoord(vh, t);
        if (_opt.vertex_has_color())
          _bi.set_color(vh, Vec4uc(c));
    }

    for (i = 0; i < faceCount_; ++i) {
        // Read number of vertices for the current face
        readValue(faceIndexType_, _in, nV);

        if (nV == 3) {
            vhandles.resize(3);
            readInteger(faceEntryType_, _in, j);
            readInteger(faceEntryType_, _in, k);
            readInteger(faceEntryType_, _in, l);

            vhandles[0] = VertexHandle(j);
            vhandles[1] = VertexHandle(k);
            vhandles[2] = VertexHandle(l);
        } else {
            vhandles.clear();
            for (j = 0; j < nV; ++j) {
                readInteger(faceEntryType_, _in, idx);
                vhandles.push_back(VertexHandle(idx));
            }
        }

        _bi.add_face(vhandles);
    }

    return true;
}